

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.h
# Opt level: O3

set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_> *
__thiscall
spvtools::val::ValidationState_t::GetExecutionModels(ValidationState_t *this,uint32_t entry_point)

{
  const_iterator cVar1;
  key_type_conflict local_4;
  
  cVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->entry_point_to_execution_models_)._M_h,&local_4);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    return (set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
            *)((long)cVar1.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>_>,_false>
                     ._M_cur + 0x10);
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.h"
                ,0x120,
                "const std::set<spv::ExecutionModel> *spvtools::val::ValidationState_t::GetExecutionModels(uint32_t) const"
               );
}

Assistant:

const std::set<spv::ExecutionModel>* GetExecutionModels(
      uint32_t entry_point) const {
    const auto it = entry_point_to_execution_models_.find(entry_point);
    if (it == entry_point_to_execution_models_.end()) {
      assert(0);
      return nullptr;
    }
    return &it->second;
  }